

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::StringPtr&,kj::StringPtr_const&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,StringPtr *params_1)

{
  StringPtr *pSVar1;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  StringPtr *local_20;
  StringPtr *params_local_1;
  StringPtr *params_local;
  
  local_20 = params;
  params_local_1 = (StringPtr *)this;
  params_local = (StringPtr *)__return_storage_ptr__;
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)this);
  local_30 = toCharSequence<kj::StringPtr&>(pSVar1);
  pSVar1 = fwd<kj::StringPtr_const&>(local_20);
  local_40 = toCharSequence<kj::StringPtr_const&>(pSVar1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,&params_1->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}